

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O1

_Bool ethash_compute_full_data
                (void *mem,uint64_t full_size,ethash_light_t light,ethash_callback_t callback)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  _Bool _Var5;
  double dVar6;
  double local_40;
  
  if ((full_size & 0x7f) == 0) {
    uVar4 = (uint)(full_size >> 6);
    _Var5 = uVar4 == 0;
    if (!_Var5) {
      uVar2 = full_size >> 6 & 0xffffffff;
      local_40 = 0.0;
      uVar3 = 0;
      do {
        if ((callback != (ethash_callback_t)0x0) &&
           ((int)((uVar3 & 0xffffffff) % (uVar2 / 100)) == 0)) {
          dVar6 = ceil(local_40 * 100.0);
          iVar1 = (*callback)((uint)(long)dVar6);
          if (iVar1 != 0) goto LAB_0012b178;
        }
        local_40 = local_40 + (double)(1.0 / (float)uVar2);
        ethash_calculate_dag_item((node *)mem,(uint32_t)uVar3,light);
        uVar3 = uVar3 + 1;
        mem = (void *)((long)mem + 0x40);
        _Var5 = (uVar4 & 0xfffffffe) == uVar3;
      } while (!_Var5);
    }
  }
  else {
LAB_0012b178:
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

bool ethash_compute_full_data(
	void* mem,
	uint64_t full_size,
	ethash_light_t const light,
	ethash_callback_t callback
)
{
	if (full_size % (sizeof(uint32_t) * MIX_WORDS) != 0 ||
		(full_size % sizeof(node)) != 0) {
		return false;
	}
	uint32_t const max_n = (uint32_t)(full_size / sizeof(node));
	node* full_nodes = mem;
	double const progress_change = 1.0f / max_n;
	double progress = 0.0f;
	// now compute full nodes
	for (uint32_t n = 0; n != max_n; ++n) {
		if (callback &&
			n % (max_n / 100) == 0 &&
			callback((unsigned int)(ceil(progress * 100.0f))) != 0) {

			return false;
		}
		progress += progress_change;
		ethash_calculate_dag_item(&(full_nodes[n]), n, light);
	}
	return true;
}